

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool ON_Mesh_Private_AddPerVertexMappingChannels
               (function<ON_TextureMapping_(const_ON_MappingChannel_*)> *get_texture_mapping_func,
               ON_MappingRef *mapping_ref,ON_SimpleArray<ON_TextureMapping::TYPE> *mappings_to_cache
               ,ON_Material *material,
               unordered_map<unsigned_int,_ON_TextureMapping,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ON_TextureMapping>_>_>
               *mappings)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ON_Texture *pOVar5;
  size_type sVar6;
  element_type *peVar7;
  double extraout_XMM0_Qa;
  ON_MappingChannel *local_108;
  function<ON_TextureMapping_(const_ON_MappingChannel_*)> local_c8;
  ON_MappingChannel *local_a8;
  ON_MappingChannel *mapping_channel_1;
  undefined1 local_98 [64];
  ON_MappingChannel *local_58;
  ON_MappingChannel *mapping_channel;
  _Node_iterator_base<std::pair<const_unsigned_int,_ON_TextureMapping>,_false> local_48;
  uint local_40;
  int local_3c;
  uint mapping_channel_id;
  int i;
  unordered_map<unsigned_int,_ON_TextureMapping,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ON_TextureMapping>_>_>
  *mappings_local;
  ON_Material *material_local;
  ON_SimpleArray<ON_TextureMapping::TYPE> *mappings_to_cache_local;
  ON_MappingRef *mapping_ref_local;
  function<ON_TextureMapping_(const_ON_MappingChannel_*)> *get_texture_mapping_func_local;
  
  _mapping_channel_id = mappings;
  mappings_local =
       (unordered_map<unsigned_int,_ON_TextureMapping,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ON_TextureMapping>_>_>
        *)material;
  material_local = (ON_Material *)mappings_to_cache;
  mappings_to_cache_local = (ON_SimpleArray<ON_TextureMapping::TYPE> *)mapping_ref;
  mapping_ref_local = (ON_MappingRef *)get_texture_mapping_func;
  for (local_3c = 0; iVar1 = local_3c,
      iVar4 = ON_ClassArray<ON_Texture>::Count
                        ((ON_ClassArray<ON_Texture> *)&mappings_local[4]._M_h._M_element_count),
      iVar1 < iVar4; local_3c = local_3c + 1) {
    pOVar5 = ON_ClassArray<ON_Texture>::operator[]
                       ((ON_ClassArray<ON_Texture> *)&mappings_local[4]._M_h._M_element_count,
                        local_3c);
    if ((pOVar5->m_bOn & 1U) != 0) {
      pOVar5 = ON_ClassArray<ON_Texture>::operator[]
                         ((ON_ClassArray<ON_Texture> *)&mappings_local[4]._M_h._M_element_count,
                          local_3c);
      local_40 = pOVar5->m_mapping_channel_id;
      local_48._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_ON_TextureMapping,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ON_TextureMapping>_>_>
           ::find(_mapping_channel_id,&local_40);
      mapping_channel =
           (ON_MappingChannel *)
           std::
           unordered_map<unsigned_int,_ON_TextureMapping,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ON_TextureMapping>_>_>
           ::end(_mapping_channel_id);
      bVar2 = std::__detail::operator==
                        (&local_48,
                         (_Node_iterator_base<std::pair<const_unsigned_int,_ON_TextureMapping>,_false>
                          *)&mapping_channel);
      if (bVar2) {
        local_58 = (ON_MappingChannel *)0x0;
        if ((mappings_to_cache_local != (ON_SimpleArray<ON_TextureMapping::TYPE> *)0x0) &&
           (local_58 = ON_MappingRef::MappingChannel
                                 ((ON_MappingRef *)mappings_to_cache_local,local_40),
           local_58 == (ON_MappingChannel *)0x0)) {
          local_58 = ON_MappingRef::MappingChannel((ON_MappingRef *)mappings_to_cache_local,1);
        }
        std::function<ON_TextureMapping_(const_ON_MappingChannel_*)>::function
                  ((function<ON_TextureMapping_(const_ON_MappingChannel_*)> *)(local_98 + 0x20),
                   get_texture_mapping_func);
        bVar2 = ON_Mesh_Private_CacheMappingChannel
                          ((function<ON_TextureMapping_(const_ON_MappingChannel_*)> *)
                           (local_98 + 0x20),local_58,
                           (ON_SimpleArray<ON_TextureMapping::TYPE> *)material_local,local_40,
                           _mapping_channel_id);
        std::function<ON_TextureMapping_(const_ON_MappingChannel_*)>::~function
                  ((function<ON_TextureMapping_(const_ON_MappingChannel_*)> *)(local_98 + 0x20));
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          return false;
        }
      }
    }
  }
  sVar6 = std::
          unordered_map<unsigned_int,_ON_TextureMapping,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ON_TextureMapping>_>_>
          ::size(_mapping_channel_id);
  if (sVar6 == 0) {
    bVar3 = ON_Material::IsPhysicallyBased((ON_Material *)mappings_local);
    mapping_channel_1._7_1_ = 0;
    bVar2 = false;
    if (bVar3) {
      ON_Material::PhysicallyBased((ON_Material *)local_98);
      mapping_channel_1._7_1_ = 1;
      peVar7 = std::
               __shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ON_PhysicallyBasedMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_98);
      (*peVar7->_vptr_ON_PhysicallyBasedMaterial[0x17])();
      bVar2 = 0.0 < extraout_XMM0_Qa;
    }
    if ((mapping_channel_1._7_1_ & 1) != 0) {
      std::shared_ptr<ON_PhysicallyBasedMaterial>::~shared_ptr
                ((shared_ptr<ON_PhysicallyBasedMaterial> *)local_98);
    }
    if (bVar2) {
      if (mappings_to_cache_local == (ON_SimpleArray<ON_TextureMapping::TYPE> *)0x0) {
        local_108 = (ON_MappingChannel *)0x0;
      }
      else {
        local_108 = ON_MappingRef::MappingChannel((ON_MappingRef *)mappings_to_cache_local,1);
      }
      local_a8 = local_108;
      std::function<ON_TextureMapping_(const_ON_MappingChannel_*)>::function
                (&local_c8,get_texture_mapping_func);
      bVar2 = ON_Mesh_Private_CacheMappingChannel
                        (&local_c8,local_a8,
                         (ON_SimpleArray<ON_TextureMapping::TYPE> *)material_local,1,
                         _mapping_channel_id);
      std::function<ON_TextureMapping_(const_ON_MappingChannel_*)>::~function(&local_c8);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

ON_DECL bool ON_Mesh_Private_AddPerVertexMappingChannels(std::function<ON_TextureMapping(const ON_MappingChannel*)> get_texture_mapping_func, const ON_MappingRef* mapping_ref, const ON_SimpleArray<ON_TextureMapping::TYPE>& mappings_to_cache, const ON_Material& material, std::unordered_map<unsigned int, ON_TextureMapping>& mappings)
{
  for (int i = 0; i < material.m_textures.Count(); i++)
  {
    if (material.m_textures[i].m_bOn)
    {
      // Get mapping channel id and check if mapping already is in the map
      const unsigned int mapping_channel_id = material.m_textures[i].m_mapping_channel_id;
      if (mappings.find(mapping_channel_id) == mappings.end())
      {
        const ON_MappingChannel* mapping_channel = nullptr;
        if (mapping_ref)
        {
          // Get texture mapping and add it to the map
          mapping_channel = mapping_ref->MappingChannel(mapping_channel_id);
          if (mapping_channel == nullptr)
          {
            // If a mapping channel is not found using 'mapping_channel_id', then try with a mapping channel id of 1.
            // This is done according to the documentation for ON_Texture::m_mapping_channel_id.
            mapping_channel = mapping_ref->MappingChannel(1);
          }
        }

        if (!ON_Mesh_Private_CacheMappingChannel(get_texture_mapping_func, mapping_channel, mappings_to_cache, mapping_channel_id, mappings))
          return false;
      }
    }
  }

  // If we didn't cache any texture coordinates above, but we have a material with anisotropy,
  // which requires tangents, which in turn requires texture coordinates, then we cache
  // the texture coordinates from mapping channel 1.
  if (mappings.size() == 0)
  {
    if (material.IsPhysicallyBased() && material.PhysicallyBased()->Anisotropic() > 0.0)
    {
      const ON_MappingChannel* mapping_channel = mapping_ref ? mapping_ref->MappingChannel(1) : nullptr;

      if (!ON_Mesh_Private_CacheMappingChannel(get_texture_mapping_func, mapping_channel, mappings_to_cache, 1, mappings))
        return false;
    }
  }

  return true;
}